

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

optional<pbrt::Token> * __thiscall
pbrt::Tokenizer::Next(optional<pbrt::Token> *__return_storage_ptr__,Tokenizer *this)

{
  int *piVar1;
  byte *pbVar2;
  char *pcVar3;
  pointer pcVar4;
  anon_struct_8_0_00000001_for___align aVar5;
  int iVar6;
  byte *pbVar7;
  bool bVar8;
  int iVar9;
  byte *pbVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  byte *pbVar15;
  char *va;
  char *vb;
  FileLoc startLoc;
  
  pbVar2 = (byte *)this->end;
  iVar6 = (this->loc).line;
  iVar9 = (this->loc).column;
  pbVar7 = (byte *)this->pos;
  do {
    pbVar15 = pbVar7;
    startLoc.line = (this->loc).line;
    startLoc.column = (this->loc).column;
    startLoc.filename._M_len = (this->loc).filename._M_len;
    startLoc.filename._M_str = (this->loc).filename._M_str;
    if (pbVar15 == pbVar2) {
      uVar12 = 0xffffffff;
      pbVar7 = pbVar15;
    }
    else {
      pbVar7 = pbVar15 + 1;
      this->pos = (char *)pbVar7;
      uVar12 = (uint)(char)*pbVar15;
      if (uVar12 == 10) {
        iVar6 = iVar6 + 1;
        (this->loc).line = iVar6;
        (this->loc).column = 0;
        iVar9 = 0;
      }
      else {
        iVar9 = iVar9 + 1;
        (this->loc).column = iVar9;
      }
    }
    if (0x5a < (int)uVar12) {
      if ((uVar12 != 0x5b) && (uVar12 != 0x5d)) goto LAB_00325ba2;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = startLoc._16_8_;
      *(size_t *)((long)&__return_storage_ptr__->optionalValue + 0x10) = startLoc.filename._M_len;
      *(char **)((long)&__return_storage_ptr__->optionalValue + 0x18) = startLoc.filename._M_str;
      __return_storage_ptr__->set = true;
      (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x1;
      goto LAB_00325c4b;
    }
    if (0x23 < uVar12) goto LAB_00325b99;
    uVar14 = (ulong)uVar12;
  } while ((0x100002600U >> (uVar14 & 0x3f) & 1) != 0);
  if (uVar14 == 0x22) {
    pbVar7 = (byte *)this->pos;
    iVar6 = (this->loc).line;
    iVar9 = (this->loc).column;
    bVar8 = false;
    do {
      while( true ) {
        do {
          while( true ) {
            if (pbVar7 == pbVar2) {
              bVar11 = 0xff;
              pbVar10 = pbVar7;
            }
            else {
              pbVar10 = pbVar7 + 1;
              this->pos = (char *)pbVar10;
              bVar11 = *pbVar7;
              if (bVar11 == 10) {
                iVar6 = iVar6 + 1;
                (this->loc).line = iVar6;
                (this->loc).column = 0;
                iVar9 = 0;
              }
              else {
                iVar9 = iVar9 + 1;
                (this->loc).column = iVar9;
              }
            }
            pbVar7 = pbVar10;
            if ('!' < (char)bVar11) break;
            if (bVar11 == 0xff) goto LAB_00325d04;
            if (bVar11 == 10) {
              va = "unterminated string";
              goto LAB_00325d14;
            }
          }
          if (bVar11 == 0x22) {
            if (!bVar8) goto LAB_00325c29;
            (this->sEscaped)._M_string_length = 0;
            *(this->sEscaped)._M_dataplus._M_p = '\0';
            pbVar7 = (byte *)this->pos;
            if (pbVar7 <= pbVar15) goto LAB_00325e25;
            goto LAB_00325d89;
          }
        } while (bVar11 != 0x5c);
        if (pbVar10 == pbVar2) goto LAB_00325d04;
        pbVar7 = pbVar10 + 1;
        this->pos = (char *)pbVar7;
        bVar11 = *pbVar10;
        if (bVar11 != 10) break;
        iVar6 = iVar6 + 1;
        (this->loc).line = iVar6;
        (this->loc).column = 0;
        bVar8 = true;
        iVar9 = 0;
      }
      iVar9 = iVar9 + 1;
      (this->loc).column = iVar9;
      bVar8 = true;
    } while (bVar11 != 0xff);
LAB_00325d04:
    va = "premature EOF";
LAB_00325d14:
    vb = (char *)&startLoc;
    if ((this->errorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->errorCallback)._M_invoker)((_Any_data *)&this->errorCallback,&va,(FileLoc **)&vb);
  }
  else {
    if (uVar14 == 0x23) {
      iVar6 = (this->loc).line;
      iVar9 = (this->loc).column;
      pbVar7 = (byte *)this->pos;
      do {
        if (pbVar7 == pbVar2) {
          bVar11 = 0xff;
          pbVar10 = pbVar7;
        }
        else {
          pbVar10 = pbVar7 + 1;
          this->pos = (char *)pbVar10;
          bVar11 = *pbVar7;
          if (bVar11 == 10) {
            iVar6 = iVar6 + 1;
            (this->loc).line = iVar6;
            (this->loc).column = 0;
            iVar9 = 0;
          }
          else {
            iVar9 = iVar9 + 1;
            (this->loc).column = iVar9;
          }
        }
        if (bVar11 == 0xff) goto LAB_00325c29;
      } while ((bVar11 != 0xd) && (pbVar7 = pbVar10, bVar11 != 10));
LAB_00325c13:
      pcVar3 = this->pos;
      this->pos = pcVar3 + -1;
      if (pcVar3[-1] == '\n') {
        piVar1 = &(this->loc).line;
        *piVar1 = *piVar1 + -1;
      }
LAB_00325c29:
      pcVar3 = this->pos;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = startLoc._16_8_;
      *(size_t *)((long)&__return_storage_ptr__->optionalValue + 0x10) = startLoc.filename._M_len;
      *(char **)((long)&__return_storage_ptr__->optionalValue + 0x18) = startLoc.filename._M_str;
      __return_storage_ptr__->set = true;
      (__return_storage_ptr__->optionalValue).__align =
           (anon_struct_8_0_00000001_for___align)((long)pcVar3 - (long)pbVar15);
LAB_00325c4b:
      *(byte **)((long)&__return_storage_ptr__->optionalValue + 8) = pbVar15;
      return __return_storage_ptr__;
    }
LAB_00325b99:
    if (uVar12 != 0xffffffff) {
LAB_00325ba2:
      iVar6 = (this->loc).line;
      iVar9 = (this->loc).column;
      pbVar7 = (byte *)this->pos;
      do {
        if (pbVar7 == pbVar2) {
          iVar13 = -1;
          pbVar10 = pbVar7;
        }
        else {
          pbVar10 = pbVar7 + 1;
          this->pos = (char *)pbVar10;
          iVar13 = (int)(char)*pbVar7;
          if (iVar13 == 10) {
            iVar6 = iVar6 + 1;
            (this->loc).line = iVar6;
            (this->loc).column = 0;
            iVar9 = 0;
          }
          else {
            iVar9 = iVar9 + 1;
            (this->loc).column = iVar9;
          }
        }
        uVar12 = iVar13 + 1;
        if (uVar12 < 0x24) {
          if ((0xa00004c00U >> ((ulong)uVar12 & 0x3f) & 1) != 0) goto LAB_00325c13;
          if ((ulong)uVar12 == 0) goto LAB_00325c29;
        }
        if ((iVar13 == 0x5d) || (pbVar7 = pbVar10, iVar13 == 0x5b)) goto LAB_00325c13;
      } while( true );
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  return __return_storage_ptr__;
LAB_00325d89:
  if (*pbVar15 == 0x5c) {
    pbVar15 = pbVar15 + 1;
    vb = (char *)pbVar7;
    if (pbVar7 <= pbVar15) {
      va = (char *)pbVar15;
      LogFatal<char_const(&)[2],char_const(&)[4],char_const(&)[2],char_const*&,char_const(&)[4],char_const*&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser.cpp"
                 ,0x11a,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [2])0x883878,
                 (char (*) [4])"pos",(char (*) [2])0x883878,&va,(char (*) [4])"pos",&vb);
    }
    bVar11 = *pbVar15;
    va = (char *)CONCAT44((int)((ulong)pbVar15 >> 0x20),(int)(char)bVar11);
    if (bVar11 < 0x66) {
      if (bVar11 < 0x5c) {
        if ((bVar11 != 0x22) && (bVar11 != 0x27)) goto LAB_00325eac;
      }
      else if ((bVar11 != 0x5c) && (bVar11 != 0x62)) goto LAB_00325eac;
    }
    else if (bVar11 < 0x72) {
      if ((bVar11 != 0x66) && (bVar11 != 0x6e)) goto LAB_00325eac;
    }
    else if ((bVar11 != 0x72) && (bVar11 != 0x74)) {
      if (bVar11 == 0xff) {
        ErrorExit(&startLoc,"premature EOF after character escape \'\\\'");
      }
LAB_00325eac:
      ErrorExit<int&>(&startLoc,"unexpected escaped character \"%c\"",(int *)&va);
    }
  }
  std::__cxx11::string::push_back((char)this + 'x');
  pbVar15 = pbVar15 + 1;
  pbVar7 = (byte *)this->pos;
  if (pbVar7 <= pbVar15) {
LAB_00325e25:
    pcVar4 = (this->sEscaped)._M_dataplus._M_p;
    aVar5 = (anon_struct_8_0_00000001_for___align)(this->sEscaped)._M_string_length;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = startLoc._16_8_;
    *(size_t *)((long)&__return_storage_ptr__->optionalValue + 0x10) = startLoc.filename._M_len;
    *(char **)((long)&__return_storage_ptr__->optionalValue + 0x18) = startLoc.filename._M_str;
    __return_storage_ptr__->set = true;
    (__return_storage_ptr__->optionalValue).__align = aVar5;
    *(pointer *)((long)&__return_storage_ptr__->optionalValue + 8) = pcVar4;
    return __return_storage_ptr__;
  }
  goto LAB_00325d89;
}

Assistant:

pstd::optional<Token> Tokenizer::Next() {
    while (true) {
        const char *tokenStart = pos;
        FileLoc startLoc = loc;

        int ch = getChar();
        if (ch == EOF)
            return {};
        else if (ch == ' ' || ch == '\n' || ch == '\t' || ch == '\r') {
            // nothing
        } else if (ch == '"') {
            // scan to closing quote
            bool haveEscaped = false;
            while ((ch = getChar()) != '"') {
                if (ch == EOF) {
                    errorCallback("premature EOF", &startLoc);
                    return {};
                } else if (ch == '\n') {
                    errorCallback("unterminated string", &startLoc);
                    return {};
                } else if (ch == '\\') {
                    haveEscaped = true;
                    // Grab the next character
                    if ((ch = getChar()) == EOF) {
                        errorCallback("premature EOF", &startLoc);
                        return {};
                    }
                }
            }

            if (!haveEscaped)
                return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
            else {
                sEscaped.clear();
                for (const char *p = tokenStart; p < pos; ++p) {
                    if (*p != '\\')
                        sEscaped.push_back(*p);
                    else {
                        ++p;
                        CHECK_LT(p, pos);
                        sEscaped.push_back(decodeEscaped(*p, startLoc));
                    }
                }
                return Token({sEscaped.data(), sEscaped.size()}, startLoc);
            }
        } else if (ch == '[' || ch == ']') {
            return Token({tokenStart, size_t(1)}, startLoc);
        } else if (ch == '#') {
            // comment: scan to EOL (or EOF)
            while ((ch = getChar()) != EOF) {
                if (ch == '\n' || ch == '\r') {
                    ungetChar();
                    break;
                }
            }

            return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
        } else {
            // Regular statement or numeric token; scan until we hit a
            // space, opening quote, or bracket.
            while ((ch = getChar()) != EOF) {
                if (ch == ' ' || ch == '\n' || ch == '\t' || ch == '\r' || ch == '"' ||
                    ch == '[' || ch == ']') {
                    ungetChar();
                    break;
                }
            }
            return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
        }
    }
}